

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_reader.cc
# Opt level: O0

void __thiscall
pstack::Dwarf::DWARFReader::readForm(DWARFReader *this,Info *info,Unit *unit,Form form)

{
  Exception *this_00;
  Exception *pEVar1;
  Exception local_1e8;
  string local_48;
  Form local_24;
  Unit *pUStack_20;
  Form form_local;
  Unit *unit_local;
  Info *info_local;
  DWARFReader *this_local;
  
  local_24 = form;
  pUStack_20 = unit;
  unit_local = (Unit *)info;
  info_local = (Info *)this;
  switch(form) {
  case DW_FORM_string:
  case DW_FORM_strp:
  case DW_FORM_line_strp:
    readFormString_abi_cxx11_(&local_48,this,info,unit,form);
    std::__cxx11::string::~string((string *)&local_48);
    break;
  default:
    this_00 = (Exception *)__cxa_allocate_exception();
    memset(&local_1e8,0,0x1a0);
    Exception::Exception(&local_1e8);
    pEVar1 = Exception::operator<<(&local_1e8,(char (*) [34])"unhandled form when reading form ");
    pEVar1 = Exception::operator<<(pEVar1,&local_24);
    Exception::Exception(this_00,pEVar1);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  case DW_FORM_data16:
    skip(this,0x10);
  }
  return;
}

Assistant:

void
DWARFReader::readForm(const Info &info, Unit &unit, Form form)
{
    switch (form) {
        case DW_FORM_string:
        case DW_FORM_line_strp:
        case DW_FORM_strp:
            readFormString(info, unit, form);
            break;
        case DW_FORM_data16:
            skip(16); // line info uses this for LNCT_MD5
            return;

        default:
            throw (Exception() << "unhandled form when reading form " << form);
    }
}